

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O0

ProgramBinary *
(anonymous_namespace)::
buildProgram<glu::ShaderProgramInfo,vk::ProgramCollection<glu::ProgramSources>::Iterator>
          (string *casePath,Iterator iter,BinaryRegistryReader *prebuiltBinRegistry,TestLog *log,
          BinaryCollection *progCollection)

{
  PtrData<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> data;
  bool bVar1;
  deBool dVar2;
  string *psVar3;
  string *__rhs;
  ProgramSources *source;
  ProgramBinary *pPVar4;
  InternalError *this;
  ProgramBinary *in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  pointer *this_00;
  ProgramBinary *returnBinary;
  NotSupportedError *err;
  Exception *anon_var_0;
  PtrData<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> local_120;
  PtrData<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *local_110;
  undefined1 local_100 [8];
  ShaderProgramInfo buildInfo;
  MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> binProg;
  ScopedLogSection local_78;
  ScopedLogSection progSection;
  ProgramIdentifier progId;
  BinaryCollection *progCollection_local;
  TestLog *log_local;
  BinaryRegistryReader *prebuiltBinRegistry_local;
  string *casePath_local;
  Iterator iter_local;
  
  progId.programName.field_2._8_8_ = progCollection;
  casePath_local = (string *)iter.m_impl._M_node;
  psVar3 = ::vk::ProgramCollection<glu::ProgramSources>::Iterator::getName_abi_cxx11_
                     ((Iterator *)&casePath_local);
  ::vk::BinaryRegistryDetail::ProgramIdentifier::ProgramIdentifier
            ((ProgramIdentifier *)&progSection,casePath,psVar3);
  psVar3 = ::vk::ProgramCollection<glu::ProgramSources>::Iterator::getName_abi_cxx11_
                     ((Iterator *)&casePath_local);
  __rhs = ::vk::ProgramCollection<glu::ProgramSources>::Iterator::getName_abi_cxx11_
                    ((Iterator *)&casePath_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &binProg.
                  super_UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>.m_data
                  .field_0x8,"Program: ",__rhs);
  tcu::ScopedLogSection::ScopedLogSection
            (&local_78,log,psVar3,
             (string *)
             &binProg.super_UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>.
              m_data.field_0x8);
  std::__cxx11::string::~string
            ((string *)
             &binProg.super_UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::MovePtr
            ((MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)
             &buildInfo.shaders.
              super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  glu::ShaderProgramInfo::ShaderProgramInfo((ShaderProgramInfo *)local_100);
  source = ::vk::ProgramCollection<glu::ProgramSources>::Iterator::getProgram
                     ((Iterator *)&casePath_local);
  pPVar4 = anon_unknown.dwarf_319fc::compileProgram(source,(ShaderProgramInfo *)local_100);
  de::DefaultDeleter<vk::ProgramBinary>::DefaultDeleter
            ((DefaultDeleter<vk::ProgramBinary> *)((long)&anon_var_0 + 7));
  de::details::MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::MovePtr
            ((MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)&local_120);
  local_110 = de::details::MovePtr::operator_cast_to_PtrData(&local_120,(MovePtr *)pPVar4);
  data._8_8_ = in_stack_fffffffffffffc80;
  data.ptr = in_stack_fffffffffffffc78;
  de::details::MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::operator=
            ((MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)
             &buildInfo.shaders.
              super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,data);
  de::details::MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::~MovePtr
            ((MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)&local_120);
  glu::operator<<(log,(ShaderProgramInfo *)local_100);
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    bVar1 = de::details::UniqueBase::operator_cast_to_bool
                      ((UniqueBase *)
                       &buildInfo.shaders.
                        super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      this_00 = &buildInfo.shaders.
                 super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pPVar4 = de::details::UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::
               get((UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)this_00)
      ;
      ::vk::ProgramCollection<vk::ProgramBinary>::add
                ((ProgramCollection<vk::ProgramBinary> *)progId.programName.field_2._8_8_,
                 (string *)((long)&progId.testCasePath.field_2 + 8),
                 (MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)this_00);
      glu::ShaderProgramInfo::~ShaderProgramInfo((ShaderProgramInfo *)local_100);
      de::details::MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::~MovePtr
                ((MovePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> *)
                 &buildInfo.shaders.
                  super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      tcu::ScopedLogSection::~ScopedLogSection(&local_78);
      ::vk::BinaryRegistryDetail::ProgramIdentifier::~ProgramIdentifier
                ((ProgramIdentifier *)&progSection);
      return pPVar4;
    }
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this,(char *)0x0,"binProg",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktTestPackage.cpp"
             ,0x81);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

vk::ProgramBinary* buildProgram (const std::string&					casePath,
								 IteratorType						iter,
								 const vk::BinaryRegistryReader&	prebuiltBinRegistry,
								 tcu::TestLog&						log,
								 vk::BinaryCollection*				progCollection)
{
	const vk::ProgramIdentifier		progId		(casePath, iter.getName());
	const tcu::ScopedLogSection		progSection	(log, iter.getName(), "Program: " + iter.getName());
	de::MovePtr<vk::ProgramBinary>	binProg;
	InfoType						buildInfo;

	try
	{
		binProg	= de::MovePtr<vk::ProgramBinary>(compileProgram(iter.getProgram(), &buildInfo));
		log << buildInfo;
	}
	catch (const tcu::NotSupportedError& err)
	{
		// Try to load from cache
		log << err << tcu::TestLog::Message << "Building from source not supported, loading stored binary instead" << tcu::TestLog::EndMessage;

		binProg = de::MovePtr<vk::ProgramBinary>(prebuiltBinRegistry.loadProgram(progId));

		log << iter.getProgram();
	}
	catch (const tcu::Exception&)
	{
		// Build failed for other reason
		log << buildInfo;
		throw;
	}

	TCU_CHECK_INTERNAL(binProg);

	{
		vk::ProgramBinary* const	returnBinary	= binProg.get();

		progCollection->add(progId.programName, binProg);

		return returnBinary;
	}
}